

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O2

bool __thiscall
Fossilize::FeatureFilter::Impl::render_pass_is_supported(Impl *this,VkRenderPassCreateInfo *info)

{
  VkSubpassDescription *pVVar1;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  ulong uVar5;
  VkFormatFeatureFlags format_features;
  uint uVar6;
  long lVar7;
  uint32_t k_1;
  uint32_t k;
  ulong uVar8;
  uint uVar9;
  uint32_t i;
  ulong uVar10;
  allocator local_49;
  key_type local_48;
  
  if ((info->flags & 0xfffffffd) == 0) {
    if (info->flags != 0) {
      std::__cxx11::string::string((string *)&local_48,"VK_QCOM_render_pass_transform",&local_49);
      sVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)this,&local_48);
      std::__cxx11::string::_M_dispose();
      if (sVar4 == 0) {
        return false;
      }
    }
    if (this->null_device != false) {
      return true;
    }
    bVar2 = pnext_chain_is_supported(this,info->pNext);
    if (bVar2) {
      uVar10 = 0;
      do {
        if (info->attachmentCount <= uVar10) {
          uVar10 = 0xffffffffffffffff;
          lVar7 = 0;
          do {
            uVar10 = uVar10 + 1;
            if (info->subpassCount <= uVar10) {
              uVar6 = info->dependencyCount;
              lVar7 = 0;
              do {
                bVar2 = (ulong)uVar6 * 0x1c + 0x1c == lVar7 + 0x1c;
                if (bVar2) {
                  return bVar2;
                }
                bVar3 = subpass_dependency_is_supported
                                  (this,(VkSubpassDependency *)
                                        ((long)&info->pDependencies->srcSubpass + lVar7));
                lVar7 = lVar7 + 0x1c;
              } while (bVar3);
              return bVar2;
            }
            bVar2 = subpass_description_is_supported
                              (this,(VkSubpassDescription *)((long)&info->pSubpasses->flags + lVar7)
                              );
            lVar7 = lVar7 + 0x48;
          } while (bVar2);
          return false;
        }
        uVar6 = 0;
        for (uVar5 = 0; uVar5 != info->subpassCount; uVar5 = uVar5 + 1) {
          pVVar1 = info->pSubpasses;
          for (uVar8 = 0; pVVar1[uVar5].colorAttachmentCount != uVar8; uVar8 = uVar8 + 1) {
            uVar9 = uVar6 | 0x80;
            if (uVar10 == pVVar1[uVar5].pColorAttachments[uVar8].attachment) {
              uVar6 = uVar9;
            }
            if ((pVVar1[uVar5].pResolveAttachments != (VkAttachmentReference *)0x0) &&
               (uVar10 == pVVar1[uVar5].pResolveAttachments[uVar8].attachment)) {
              uVar6 = uVar9;
            }
          }
          for (uVar8 = 0; pVVar1[uVar5].inputAttachmentCount != uVar8; uVar8 = uVar8 + 1) {
            uVar6 = uVar6 | uVar10 == pVVar1[uVar5].pInputAttachments[uVar8].attachment;
          }
          if ((pVVar1[uVar5].pDepthStencilAttachment != (VkAttachmentReference *)0x0) &&
             (uVar10 == (pVVar1[uVar5].pDepthStencilAttachment)->attachment)) {
            uVar6 = uVar6 | 0x200;
          }
        }
        bVar2 = attachment_description_is_supported(this,info->pAttachments + uVar10,uVar6);
        uVar10 = uVar10 + 1;
      } while (bVar2);
    }
  }
  return false;
}

Assistant:

bool FeatureFilter::Impl::render_pass_is_supported(const VkRenderPassCreateInfo *info) const
{
	// Only allow flags we recognize and validate.
	constexpr VkRenderPassCreateFlags supported_flags = VK_RENDER_PASS_CREATE_TRANSFORM_BIT_QCOM;
	if ((info->flags & ~supported_flags) != 0)
		return false;

	if ((info->flags & VK_RENDER_PASS_CREATE_TRANSFORM_BIT_QCOM) != 0 &&
	    enabled_extensions.count(VK_QCOM_RENDER_PASS_TRANSFORM_EXTENSION_NAME) == 0)
		return false;

	if (null_device)
		return true;

	if (!pnext_chain_is_supported(info->pNext))
		return false;

	for (uint32_t i = 0; i < info->attachmentCount; i++)
	{
		VkFormatFeatureFlags format_features = 0;

		for (uint32_t j = 0; j < info->subpassCount; j++)
		{
			for (uint32_t k = 0; k < info->pSubpasses[j].colorAttachmentCount; k++)
			{
				if (info->pSubpasses[j].pColorAttachments[k].attachment == i)
					format_features |= VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT;

				if (info->pSubpasses[j].pResolveAttachments &&
				    info->pSubpasses[j].pResolveAttachments[k].attachment == i)
				{
					format_features |= VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT;
				}
			}

			for (uint32_t k = 0; k < info->pSubpasses[j].inputAttachmentCount; k++)
				if (info->pSubpasses[j].pInputAttachments[k].attachment == i)
					format_features |= VK_FORMAT_FEATURE_SAMPLED_IMAGE_BIT;

			if (info->pSubpasses[j].pDepthStencilAttachment &&
			    info->pSubpasses[j].pDepthStencilAttachment->attachment == i)
			{
				format_features |= VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT;
			}
		}

		if (!attachment_description_is_supported(info->pAttachments[i], format_features))
			return false;
	}

	for (uint32_t i = 0; i < info->subpassCount; i++)
	{
		if (!subpass_description_is_supported(info->pSubpasses[i]))
			return false;
	}

	for (uint32_t i = 0; i < info->dependencyCount; i++)
	{
		if (!subpass_dependency_is_supported(info->pDependencies[i]))
			return false;
	}

	return true;
}